

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  Bytef BVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int val_1;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  int val;
  
  if (s->last_lit == 0) {
    iVar8 = s->bi_valid;
  }
  else {
    uVar10 = 0;
    do {
      uVar3 = s->d_buf[uVar10];
      bVar1 = s->l_buf[uVar10];
      if (uVar3 == 0) {
        uVar3 = ltree[bVar1].dl.dad;
        iVar8 = s->bi_valid;
        uVar4 = ltree[bVar1].fc.freq;
        uVar11 = uVar4 << ((byte)iVar8 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar11;
        if ((int)(0x10 - (uint)uVar3) < iVar8) {
          uVar14 = s->pending;
          s->pending = uVar14 + 1;
          s->pending_buf[uVar14] = (Bytef)uVar11;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar14 = s->pending;
          s->pending = uVar14 + 1;
          s->pending_buf[uVar14] = BVar2;
          s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar8 = (uint)uVar3 + s->bi_valid + -0x10;
        }
        else {
          iVar8 = iVar8 + (uint)uVar3;
        }
LAB_001aaad7:
        s->bi_valid = iVar8;
      }
      else {
        uVar12 = (ulong)""[bVar1];
        uVar4 = ltree[uVar12 + 0x101].dl.dad;
        iVar8 = s->bi_valid;
        uVar11 = ltree[uVar12 + 0x101].fc.freq;
        uVar13 = uVar11 << ((byte)iVar8 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar13;
        if ((int)(0x10 - (uint)uVar4) < iVar8) {
          uVar14 = s->pending;
          s->pending = uVar14 + 1;
          s->pending_buf[uVar14] = (Bytef)uVar13;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar14 = s->pending;
          s->pending = uVar14 + 1;
          s->pending_buf[uVar14] = BVar2;
          uVar13 = uVar11 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar13;
          iVar8 = (uint)uVar4 + s->bi_valid + -0x10;
        }
        else {
          iVar8 = iVar8 + (uint)uVar4;
        }
        uVar14 = (uint)uVar13;
        s->bi_valid = iVar8;
        if (0xffffffffffffffeb < uVar12 - 0x1c) {
          iVar5 = extra_lbits[uVar12];
          iVar6 = base_length[uVar12];
          uVar14 = uVar14 | (uint)bVar1 - iVar6 << ((byte)iVar8 & 0x1f);
          s->bi_buf = (ush)uVar14;
          if (0x10 - iVar5 < iVar8) {
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = (Bytef)uVar14;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar14 = s->pending;
            s->pending = uVar14 + 1;
            s->pending_buf[uVar14] = BVar2;
            uVar14 = ((uint)bVar1 - iVar6 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f);
            s->bi_buf = (ush)uVar14;
            iVar8 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            iVar8 = iVar5 + iVar8;
          }
          s->bi_valid = iVar8;
        }
        uVar9 = uVar3 - 1;
        uVar7 = (uVar9 >> 7) + 0x100;
        if (uVar3 < 0x101) {
          uVar7 = uVar9;
        }
        bVar1 = ""[uVar7];
        uVar3 = dtree[bVar1].dl.dad;
        uVar4 = dtree[bVar1].fc.freq;
        uVar14 = uVar14 | (uint)uVar4 << ((byte)iVar8 & 0x1f);
        s->bi_buf = (ush)uVar14;
        if ((int)(0x10 - (uint)uVar3) < iVar8) {
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = (Bytef)uVar14;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar14 = s->pending;
          s->pending = uVar14 + 1;
          s->pending_buf[uVar14] = BVar2;
          uVar4 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar4;
          iVar8 = (uint)uVar3 + s->bi_valid + -0x10;
          uVar14 = (uint)uVar4;
        }
        else {
          iVar8 = iVar8 + (uint)uVar3;
        }
        s->bi_valid = iVar8;
        if (3 < bVar1) {
          iVar5 = extra_dbits[bVar1];
          iVar6 = base_dist[bVar1];
          uVar14 = uVar14 | uVar9 - iVar6 << ((byte)iVar8 & 0x1f);
          s->bi_buf = (ush)uVar14;
          if (0x10 - iVar5 < iVar8) {
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = (Bytef)uVar14;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar14 = s->pending;
            s->pending = uVar14 + 1;
            s->pending_buf[uVar14] = BVar2;
            s->bi_buf = (ush)((uVar9 - iVar6 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar8 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            iVar8 = iVar5 + iVar8;
          }
          goto LAB_001aaad7;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < s->last_lit);
  }
  uVar3 = ltree[0x100].dl.dad;
  uVar4 = ltree[0x100].fc.freq;
  uVar11 = uVar4 << ((byte)iVar8 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar11;
  if ((int)(0x10 - (uint)uVar3) < iVar8) {
    uVar14 = s->pending;
    s->pending = uVar14 + 1;
    s->pending_buf[uVar14] = (Bytef)uVar11;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar14 = s->pending;
    s->pending = uVar14 + 1;
    s->pending_buf[uVar14] = BVar2;
    s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar8 = (uint)uVar3 + s->bi_valid + -0x10;
  }
  else {
    iVar8 = iVar8 + (uint)uVar3;
  }
  s->bi_valid = iVar8;
  s->last_eob_len = (uint)ltree[0x100].dl.dad;
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    ct_data *ltree; /* literal tree */
    ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->last_lit != 0) do {
        dist = s->d_buf[lx];
        lc = s->l_buf[lx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and d_buf+l_buf is ok: */
        Assert((uInt)(s->pending) < s->lit_bufsize + 2*lx,
               "pendingBuf overflow");

    } while (lx < s->last_lit);

    send_code(s, END_BLOCK, ltree);
    s->last_eob_len = ltree[END_BLOCK].Len;
}